

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void ssl_calc_finished_ssl(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  mbedtls_ssl_session *pmVar1;
  uchar *input;
  long lVar2;
  char *input_00;
  uchar md5sum [16];
  uchar sha1sum [20];
  mbedtls_md5_context md5;
  uchar padbuf [48];
  mbedtls_sha1_context sha1;
  uchar local_148 [16];
  uchar local_138 [24];
  mbedtls_md5_context local_120;
  uchar local_c8 [60];
  mbedtls_sha1_context local_8c;
  
  pmVar1 = ssl->session_negotiate;
  if (pmVar1 == (mbedtls_ssl_session *)0x0) {
    pmVar1 = ssl->session;
  }
  lVar2 = 0;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1203,"=> calc  finished ssl");
  mbedtls_md5_init(&local_120);
  mbedtls_sha1_init(&local_8c);
  mbedtls_md5_clone(&local_120,&ssl->handshake->fin_md5);
  mbedtls_sha1_clone(&local_8c,&ssl->handshake->fin_sha1);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1216,"finished  md5 state",(uchar *)local_120.state,0x10);
  mbedtls_debug_print_buf
            (ssl,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x121b,"finished sha1 state",(uchar *)local_8c.state,0x14);
  input_00 = "SRVR";
  if (from == 0) {
    input_00 = "CLNT";
  }
  builtin_memcpy(local_c8,"666666666666666666666666666666666666666666666666",0x30);
  mbedtls_md5_update(&local_120,(uchar *)input_00,4);
  input = pmVar1->master;
  mbedtls_md5_update(&local_120,input,0x30);
  mbedtls_md5_update(&local_120,local_c8,0x30);
  mbedtls_md5_finish(&local_120,local_148);
  mbedtls_sha1_update(&local_8c,(uchar *)input_00,4);
  mbedtls_sha1_update(&local_8c,input,0x30);
  mbedtls_sha1_update(&local_8c,local_c8,0x28);
  mbedtls_sha1_finish(&local_8c,local_138);
  builtin_memcpy(local_c8,
                 "\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\"
                 ,0x30);
  mbedtls_md5_starts(&local_120);
  mbedtls_md5_update(&local_120,input,0x30);
  mbedtls_md5_update(&local_120,local_c8,0x30);
  mbedtls_md5_update(&local_120,local_148,0x10);
  mbedtls_md5_finish(&local_120,buf);
  mbedtls_sha1_starts(&local_8c);
  mbedtls_sha1_update(&local_8c,input,0x30);
  mbedtls_sha1_update(&local_8c,local_c8,0x28);
  mbedtls_sha1_update(&local_8c,local_138,0x14);
  mbedtls_sha1_finish(&local_8c,buf + 0x10);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x123b,"calc finished result",buf,0x24);
  mbedtls_md5_free(&local_120);
  mbedtls_sha1_free(&local_8c);
  do {
    local_c8[lVar2] = '\0';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x30);
  lVar2 = 0;
  do {
    local_148[lVar2] = '\0';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  lVar2 = 0;
  do {
    local_138[lVar2] = '\0';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x14);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1244,"<= calc  finished");
  return;
}

Assistant:

static void ssl_calc_finished_ssl(
                mbedtls_ssl_context *ssl, unsigned char *buf, int from )
{
    const char *sender;
    mbedtls_md5_context  md5;
    mbedtls_sha1_context sha1;

    unsigned char padbuf[48];
    unsigned char md5sum[16];
    unsigned char sha1sum[20];

    mbedtls_ssl_session *session = ssl->session_negotiate;
    if( !session )
        session = ssl->session;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc  finished ssl" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

    /*
     * SSLv3:
     *   hash =
     *      MD5( master + pad2 +
     *          MD5( handshake + sender + master + pad1 ) )
     *   + SHA1( master + pad2 +
     *         SHA1( handshake + sender + master + pad1 ) )
     */

#if !defined(MBEDTLS_MD5_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished  md5 state", (unsigned char *)
                    md5.state, sizeof(  md5.state ) );
#endif

#if !defined(MBEDTLS_SHA1_ALT)
    MBEDTLS_SSL_DEBUG_BUF( 4, "finished sha1 state", (unsigned char *)
                   sha1.state, sizeof( sha1.state ) );
#endif

    sender = ( from == MBEDTLS_SSL_IS_CLIENT ) ? "CLNT"
                                       : "SRVR";

    memset( padbuf, 0x36, 48 );

    mbedtls_md5_update( &md5, (const unsigned char *) sender, 4 );
    mbedtls_md5_update( &md5, session->master, 48 );
    mbedtls_md5_update( &md5, padbuf, 48 );
    mbedtls_md5_finish( &md5, md5sum );

    mbedtls_sha1_update( &sha1, (const unsigned char *) sender, 4 );
    mbedtls_sha1_update( &sha1, session->master, 48 );
    mbedtls_sha1_update( &sha1, padbuf, 40 );
    mbedtls_sha1_finish( &sha1, sha1sum );

    memset( padbuf, 0x5C, 48 );

    mbedtls_md5_starts( &md5 );
    mbedtls_md5_update( &md5, session->master, 48 );
    mbedtls_md5_update( &md5, padbuf, 48 );
    mbedtls_md5_update( &md5, md5sum, 16 );
    mbedtls_md5_finish( &md5, buf );

    mbedtls_sha1_starts( &sha1 );
    mbedtls_sha1_update( &sha1, session->master, 48 );
    mbedtls_sha1_update( &sha1, padbuf , 40 );
    mbedtls_sha1_update( &sha1, sha1sum, 20 );
    mbedtls_sha1_finish( &sha1, buf + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calc finished result", buf, 36 );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    mbedtls_zeroize(  padbuf, sizeof(  padbuf ) );
    mbedtls_zeroize(  md5sum, sizeof(  md5sum ) );
    mbedtls_zeroize( sha1sum, sizeof( sha1sum ) );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc  finished" ) );
}